

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O0

MppBuffer h264e_vepu_buf_get_frame_buffer(HalH264eVepuBufs *bufs,RK_S32 index)

{
  MppBuffer local_20;
  MppBuffer buf;
  HalH264eVepuBufs *pHStack_10;
  RK_S32 index_local;
  HalH264eVepuBufs *bufs_local;
  
  local_20 = bufs->frm_buf[index];
  buf._4_4_ = index;
  pHStack_10 = bufs;
  if ((hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter\n","h264e_vepu_buf_get_frame_buffer",bufs);
  }
  if (local_20 == (MppBuffer)0x0) {
    mpp_buffer_get_with_tag
              (pHStack_10->group,&local_20,pHStack_10->frm_size,"hal_h264e_vepu_v2",
               "h264e_vepu_buf_get_frame_buffer");
    if ((local_20 == (MppBuffer)0x0) &&
       (_mpp_log_l(2,"hal_h264e_vepu_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"buf",
                   "h264e_vepu_buf_get_frame_buffer",0x125), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    pHStack_10->frm_buf[buf._4_4_] = local_20;
    pHStack_10->frm_cnt = pHStack_10->frm_cnt + 1;
  }
  if ((hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave %p\n","h264e_vepu_buf_get_frame_buffer",pHStack_10);
  }
  return local_20;
}

Assistant:

MppBuffer h264e_vepu_buf_get_frame_buffer(HalH264eVepuBufs *bufs, RK_S32 index)
{
    MppBuffer buf = bufs->frm_buf[index];

    hal_h264e_dbg_buffer("enter\n", bufs);

    if (NULL == buf) {
        mpp_buffer_get(bufs->group, &buf, bufs->frm_size);
        mpp_assert(buf);
        bufs->frm_buf[index] = buf;
        bufs->frm_cnt++;
    }

    hal_h264e_dbg_buffer("leave %p\n", bufs);

    return buf;
}